

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int moveToRoot(BtCursor *pCur)

{
  char cVar1;
  int iVar2;
  BtCursor *in_RDI;
  Pgno unaff_retaddr;
  Pgno subpage;
  int rc;
  MemPage *pRoot;
  u32 newPgno;
  undefined8 in_stack_ffffffffffffffe8;
  BtCursor *pCur_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  newPgno = 0;
  if (in_RDI->iPage < '\0') {
    if (in_RDI->pgnoRoot == 0) {
      in_RDI->eState = '\x01';
      return 0x10;
    }
    if (2 < in_RDI->eState) {
      if (in_RDI->eState == '\x04') {
        return in_RDI->skipNext;
      }
      sqlite3BtreeClearCursor((BtCursor *)0x16ee31);
    }
    iVar2 = getAndInitPage(_subpage,unaff_retaddr,
                           (MemPage **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,in_RDI,iVar2);
    if (iVar2 != 0) {
      in_RDI->eState = '\x01';
      return iVar2;
    }
    in_RDI->iPage = '\0';
    in_RDI->curIntKey = in_RDI->pPage->intKey;
  }
  else if (in_RDI->iPage != '\0') {
    releasePageNotNull((MemPage *)0x16ed8b);
    while (cVar1 = in_RDI->iPage + -1, in_RDI->iPage = cVar1, cVar1 != '\0') {
      releasePageNotNull((MemPage *)0x16edb8);
    }
    in_RDI->pPage = in_RDI->apPage[0];
    goto LAB_0016eefc;
  }
  newPgno = 0;
  if ((in_RDI->pPage->isInit == '\0') ||
     ((in_RDI->pKeyInfo == (KeyInfo *)0x0) != (bool)in_RDI->pPage->intKey)) {
    iVar2 = sqlite3CorruptError(0);
    return iVar2;
  }
LAB_0016eefc:
  in_RDI->ix = 0;
  (in_RDI->info).nSize = 0;
  in_RDI->curFlags = in_RDI->curFlags & 0xf1;
  pCur_00 = (BtCursor *)in_RDI->pPage;
  if (*(short *)((long)&pCur_00->aOverflow + 6) == 0) {
    if (*(char *)&pCur_00->pBtree == '\0') {
      if (pCur_00->skipNext == 1) {
        sqlite3Get4byte((u8 *)(*(long *)&pCur_00->pgnoRoot +
                              (long)(int)(*(byte *)((long)&pCur_00->pBtree + 1) + 8)));
        in_RDI->eState = '\0';
        newPgno = moveToChild(pCur_00,newPgno);
      }
      else {
        newPgno = sqlite3CorruptError(0);
      }
    }
    else {
      in_RDI->eState = '\x01';
      newPgno = 0x10;
    }
  }
  else {
    in_RDI->eState = '\0';
  }
  return newPgno;
}

Assistant:

static int moveToRoot(BtCursor *pCur){
  MemPage *pRoot;
  int rc = SQLITE_OK;

  assert( cursorOwnsBtShared(pCur) );
  assert( CURSOR_INVALID < CURSOR_REQUIRESEEK );
  assert( CURSOR_VALID   < CURSOR_REQUIRESEEK );
  assert( CURSOR_FAULT   > CURSOR_REQUIRESEEK );
  assert( pCur->eState < CURSOR_REQUIRESEEK || pCur->iPage<0 );
  assert( pCur->pgnoRoot>0 || pCur->iPage<0 );

  if( pCur->iPage>=0 ){
    if( pCur->iPage ){
      releasePageNotNull(pCur->pPage);
      while( --pCur->iPage ){
        releasePageNotNull(pCur->apPage[pCur->iPage]);
      }
      pCur->pPage = pCur->apPage[0];
      goto skip_init;
    }
  }else if( pCur->pgnoRoot==0 ){
    pCur->eState = CURSOR_INVALID;
    return SQLITE_EMPTY;
  }else{
    assert( pCur->iPage==(-1) );
    if( pCur->eState>=CURSOR_REQUIRESEEK ){
      if( pCur->eState==CURSOR_FAULT ){
        assert( pCur->skipNext!=SQLITE_OK );
        return pCur->skipNext;
      }
      sqlite3BtreeClearCursor(pCur);
    }
    rc = getAndInitPage(pCur->pBtree->pBt, pCur->pgnoRoot, &pCur->pPage,
                        0, pCur->curPagerFlags);
    if( rc!=SQLITE_OK ){
      pCur->eState = CURSOR_INVALID;
      return rc;
    }
    pCur->iPage = 0;
    pCur->curIntKey = pCur->pPage->intKey;
  }
  pRoot = pCur->pPage;
  assert( pRoot->pgno==pCur->pgnoRoot );

  /* If pCur->pKeyInfo is not NULL, then the caller that opened this cursor
  ** expected to open it on an index b-tree. Otherwise, if pKeyInfo is
  ** NULL, the caller expects a table b-tree. If this is not the case,
  ** return an SQLITE_CORRUPT error. 
  **
  ** Earlier versions of SQLite assumed that this test could not fail
  ** if the root page was already loaded when this function was called (i.e.
  ** if pCur->iPage>=0). But this is not so if the database is corrupted 
  ** in such a way that page pRoot is linked into a second b-tree table 
  ** (or the freelist).  */
  assert( pRoot->intKey==1 || pRoot->intKey==0 );
  if( pRoot->isInit==0 || (pCur->pKeyInfo==0)!=pRoot->intKey ){
    return SQLITE_CORRUPT_PAGE(pCur->pPage);
  }

skip_init:  
  pCur->ix = 0;
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidNKey|BTCF_ValidOvfl);

  pRoot = pCur->pPage;
  if( pRoot->nCell>0 ){
    pCur->eState = CURSOR_VALID;
  }else if( !pRoot->leaf ){
    Pgno subpage;
    if( pRoot->pgno!=1 ) return SQLITE_CORRUPT_BKPT;
    subpage = get4byte(&pRoot->aData[pRoot->hdrOffset+8]);
    pCur->eState = CURSOR_VALID;
    rc = moveToChild(pCur, subpage);
  }else{
    pCur->eState = CURSOR_INVALID;
    rc = SQLITE_EMPTY;
  }
  return rc;
}